

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O3

void __thiscall
Test_TemplateModifiers_ValidateImgSrcUrlCssEscape::Test_TemplateModifiers_ValidateImgSrcUrlCssEscape
          (Test_TemplateModifiers_ValidateImgSrcUrlCssEscape *this)

{
  _func_void *local_8;
  
  local_8 = Run;
  if (g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*)()>
              ((vector<void(*)(),std::allocator<void(*)()>> *)&g_testlist,
               (iterator)
               g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_8);
  }
  else {
    *g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
     super__Vector_impl_data._M_finish = Run;
    g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
    super__Vector_impl_data._M_finish =
         g_testlist.super__Vector_base<void_(*)(),_std::allocator<void_(*)()>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

TEST(TemplateModifiers, ValidateImgSrcUrlCssEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestValidateImgSrcUrlCssEscape", NULL);
  dict.SetEscapedValue("easy http URL", "http://www.google.com",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_css_escape);
  dict.SetEscapedValue("harder https URL",
                       "https://www.google.com/search?q=f&hl=en",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_css_escape);
  dict.SetEscapedValue("javascript URL",
                       "javascript:alert(document.cookie)",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_css_escape);
  dict.SetEscapedValue("relative URL", "/search?q=green flowers&hl=en",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_css_escape);
  dict.SetEscapedValue("hardest URL", "http://www.google.com/s?q='bla'"
                       "&a=\"\"&b=(<tag>)&c=*\r\n\\\\bla",
                       GOOGLE_NAMESPACE::validate_img_src_url_and_css_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy http URL"),
               "http://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("harder https URL"),
               "https://www.google.com/search?q=f&hl=en");
  EXPECT_STREQ(peer.GetSectionValue("javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeImgSrcUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("relative URL"),
               "/search?q=green flowers&hl=en");
  EXPECT_STREQ(peer.GetSectionValue("hardest URL"),
               "http://www.google.com/s?q=%27bla%27"
               "&a=%22%22&b=%28%3Ctag%3E%29&c=%2A%0D%0A%5C%5Cbla");
}